

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

UTimeZoneFormatTimeType icu_63::TimeZoneFormat::getTimeType(UTimeZoneNameType nameType)

{
  UTimeZoneFormatTimeType UVar1;
  
  UVar1 = UTZFMT_TIME_TYPE_STANDARD;
  if (nameType != UTZNM_LONG_STANDARD) {
    if (nameType == UTZNM_SHORT_DAYLIGHT) {
      return UTZFMT_TIME_TYPE_DAYLIGHT;
    }
    if (nameType != UTZNM_SHORT_STANDARD) {
      if (nameType == UTZNM_LONG_DAYLIGHT) {
        return UTZFMT_TIME_TYPE_DAYLIGHT;
      }
      UVar1 = UTZFMT_TIME_TYPE_UNKNOWN;
    }
  }
  return UVar1;
}

Assistant:

UTimeZoneFormatTimeType
TimeZoneFormat::getTimeType(UTimeZoneNameType nameType) {
    switch (nameType) {
    case UTZNM_LONG_STANDARD:
    case UTZNM_SHORT_STANDARD:
        return UTZFMT_TIME_TYPE_STANDARD;

    case UTZNM_LONG_DAYLIGHT:
    case UTZNM_SHORT_DAYLIGHT:
        return UTZFMT_TIME_TYPE_DAYLIGHT;

    default:
        return UTZFMT_TIME_TYPE_UNKNOWN;
    }
}